

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_compress_stream_start(FILE *f)

{
  int iVar1;
  FILE *f_local;
  
  stb__out = (stb_uchar *)0x0;
  stb__outfile = f;
  if (f == (FILE *)0x0) {
    f_local._4_4_ = 0;
  }
  else {
    iVar1 = stb_compress_streaming_start();
    if (iVar1 == 0) {
      f_local._4_4_ = 0;
    }
    else {
      f_local._4_4_ = 1;
    }
  }
  return f_local._4_4_;
}

Assistant:

int stb_compress_stream_start(FILE *f)
{
   stb__out = NULL;
   stb__outfile = f;

   if (f == NULL)
      return 0;

   if (!stb_compress_streaming_start())
      return 0;

   return 1;
}